

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * google::protobuf::internal::InlineGreedyStringParser(string *s,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  uint size;
  char *pcVar2;
  pair<const_char_*,_int> pVar3;
  
  bVar1 = *ptr;
  size = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar3 = ReadSizeFallback(ptr,(uint)bVar1);
    size = pVar3.second;
    pcVar2 = pVar3.first;
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    pcVar2 = ptr + 1;
  }
  pcVar2 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar2,size,s);
  return pcVar2;
}

Assistant:

const char* InlineGreedyStringParser(std::string* s, const char* ptr,
                                     ParseContext* ctx) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  return ctx->ReadString(ptr, size, s);
}